

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_TryGetPropertyInt64(JSContext *ctx,JSValue obj,int64_t idx,JSValue *pval)

{
  int iVar1;
  JSAtom prop;
  JSValue JVar2;
  
  if ((ulong)idx < 0x80000000) {
    iVar1 = JS_HasProperty(ctx,obj,(uint)idx | 0x80000000);
    if (0 < iVar1) {
      JVar2.tag = 0;
      JVar2.u = (JSValueUnion)idx;
      JVar2 = JS_GetPropertyValue(ctx,obj,JVar2);
      if ((int)JVar2.tag == 6) {
        iVar1 = -1;
      }
      goto LAB_00139d39;
    }
  }
  else {
    prop = JS_NewAtomInt64(ctx,idx);
    if (prop != 0) {
      iVar1 = JS_HasProperty(ctx,obj,prop);
      if (iVar1 < 1) {
        JVar2 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        JVar2 = JS_GetPropertyInternal(ctx,obj,prop,obj,0);
        if ((int)JVar2.tag == 6) {
          iVar1 = -1;
        }
      }
      JS_FreeAtom(ctx,prop);
      goto LAB_00139d39;
    }
    iVar1 = -1;
  }
  JVar2 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00139d39:
  *pval = JVar2;
  return iVar1;
}

Assistant:

static int JS_TryGetPropertyInt64(JSContext *ctx, JSValueConst obj, int64_t idx, JSValue *pval)
{
    JSValue val = JS_UNDEFINED;
    JSAtom prop;
    int present;

    if (likely((uint64_t)idx <= JS_ATOM_MAX_INT)) {
        /* fast path */
        present = JS_HasProperty(ctx, obj, __JS_AtomFromUInt32(idx));
        if (present > 0) {
            val = JS_GetPropertyValue(ctx, obj, JS_NewInt32(ctx, idx));
            if (unlikely(JS_IsException(val)))
                present = -1;
        }
    } else {
        prop = JS_NewAtomInt64(ctx, idx);
        present = -1;
        if (likely(prop != JS_ATOM_NULL)) {
            present = JS_HasProperty(ctx, obj, prop);
            if (present > 0) {
                val = JS_GetProperty(ctx, obj, prop);
                if (unlikely(JS_IsException(val)))
                    present = -1;
            }
            JS_FreeAtom(ctx, prop);
        }
    }
    *pval = val;
    return present;
}